

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawIndexedIndirectParams::addCommand
          (DrawIndexedIndirectParams *this,deUint32 indexC,deUint32 instanceC,deUint32 firstIdx,
          deInt32 vertexO,deUint32 firstIns)

{
  undefined1 local_38 [8];
  VkDrawIndexedIndirectCommand cmd;
  deUint32 firstIns_local;
  deInt32 vertexO_local;
  deUint32 firstIdx_local;
  deUint32 instanceC_local;
  deUint32 indexC_local;
  DrawIndexedIndirectParams *this_local;
  
  local_38._0_4_ = indexC;
  local_38._4_4_ = instanceC;
  cmd.indexCount = firstIdx;
  cmd.instanceCount = vertexO;
  cmd.firstIndex = firstIns;
  cmd.vertexOffset = firstIns;
  cmd.firstInstance = vertexO;
  std::vector<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>::
  push_back(&this->commands,(value_type *)local_38);
  return;
}

Assistant:

void addCommand (const deUint32 indexC, const deUint32 instanceC, const deUint32 firstIdx, const deInt32 vertexO, const deUint32 firstIns)
	{
		vk::VkDrawIndexedIndirectCommand	cmd;
		cmd.indexCount						= indexC;
		cmd.instanceCount					= instanceC;
		cmd.firstIndex						= firstIdx;
		cmd.vertexOffset					= vertexO;
		cmd.firstInstance					= firstIns;

		commands.push_back(cmd);
	}